

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_show_aqr(REF_INT m,REF_INT n,REF_DBL *a,REF_DBL *q,REF_DBL *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  REF_DBL *pRVar5;
  REF_DBL *local_40;
  
  uVar1 = (ulong)(uint)n;
  uVar3 = (ulong)(uint)m;
  if ((a != (REF_DBL *)0x0) && (puts("A"), 0 < m)) {
    uVar4 = 0;
    do {
      uVar2 = uVar1;
      pRVar5 = a;
      if (0 < n) {
        do {
          printf(" %12.4e",*pRVar5);
          uVar2 = uVar2 - 1;
          pRVar5 = pRVar5 + uVar3;
        } while (uVar2 != 0);
      }
      putchar(10);
      uVar4 = uVar4 + 1;
      a = a + 1;
    } while (uVar4 != uVar3);
  }
  puts("Q");
  if (0 < m) {
    uVar4 = 0;
    local_40 = q;
    do {
      uVar2 = uVar1;
      pRVar5 = local_40;
      if (0 < n) {
        do {
          printf(" %12.4e",*pRVar5);
          uVar2 = uVar2 - 1;
          pRVar5 = pRVar5 + uVar3;
        } while (uVar2 != 0);
      }
      putchar(10);
      uVar4 = uVar4 + 1;
      local_40 = local_40 + 1;
    } while (uVar4 != uVar3);
  }
  puts("R");
  if (0 < n) {
    uVar4 = 0;
    uVar3 = uVar1;
    pRVar5 = r;
    do {
      do {
        printf(" %12.4e",*r);
        r = r + uVar1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
      putchar(10);
      uVar4 = uVar4 + 1;
      r = pRVar5 + 1;
      uVar3 = uVar1;
      pRVar5 = r;
    } while (uVar4 != uVar1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_aqr(REF_INT m, REF_INT n, REF_DBL *a,
                                       REF_DBL *q, REF_DBL *r) {
  REF_INT row, col;

  if (NULL != a) {
    printf("A\n");
    for (row = 0; row < m; row++) {
      for (col = 0; col < n; col++) {
        printf(" %12.4e", a[row + m * col]);
      }
      printf("\n");
    }
  }
  printf("Q\n");
  for (row = 0; row < m; row++) {
    for (col = 0; col < n; col++) {
      printf(" %12.4e", q[row + m * col]);
    }
    printf("\n");
  }
  printf("R\n");
  for (row = 0; row < n; row++) {
    for (col = 0; col < n; col++) {
      printf(" %12.4e", r[row + n * col]);
    }
    printf("\n");
  }

  return REF_SUCCESS;
}